

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O1

string_view __thiscall absl::lts_20250127::ByChar::Find(ByChar *this,string_view text,size_t pos)

{
  void *pvVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  string_view sVar6;
  
  pcVar3 = text._M_str;
  uVar5 = text._M_len;
  uVar4 = 0xffffffffffffffff;
  if (pos <= uVar5 && uVar5 - pos != 0) {
    pvVar1 = memchr(pcVar3 + pos,(int)this->c_,uVar5 - pos);
    uVar4 = -(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)pcVar3;
  }
  if (uVar4 == 0xffffffffffffffff) {
    uVar2 = 0;
  }
  else {
    if (uVar5 < uVar4) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar4,uVar5);
    }
    uVar2 = (ulong)(uVar4 != uVar5);
    uVar5 = uVar4;
  }
  sVar6._M_str = pcVar3 + uVar5;
  sVar6._M_len = uVar2;
  return sVar6;
}

Assistant:

absl::string_view ByChar::Find(absl::string_view text, size_t pos) const {
  size_t found_pos = text.find(c_, pos);
  if (found_pos == absl::string_view::npos)
    return absl::string_view(text.data() + text.size(), 0);
  return text.substr(found_pos, 1);
}